

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

char * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
extractPointer(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  uint8_t *puVar1;
  Converter converter;
  
  puVar1 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12cd53);
  return *(char **)(puVar1 + 1);
}

Assistant:

char const* extractPointer() const {
    union Converter {
      char const* value;
      char binary[sizeof(char const*)];
    } converter;
    std::memcpy(&converter.binary[0], start() + 1, sizeof(char const*));
    return converter.value;
  }